

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

void GUIDestroy(HGUI handle)

{
  operator_delete(*(void **)((long)handle + 0x10),0x41f80);
  ShaderProgramDestroy((ShaderProgram *)handle);
  std::__cxx11::string::~string((string *)((long)handle + 0x1a0ca8));
  operator_delete(handle,0x1a0cc8);
  return;
}

Assistant:

void GUIDestroy(HGUI handle) {
    GUI* gui = (GUI*)handle;
    delete gui->Ctx;
    ShaderProgramDestroy(gui->Program);
    delete gui;
}